

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int iVar19;
  int iVar20;
  undefined4 uVar21;
  Scene *pSVar22;
  Geometry *pGVar23;
  RTCFilterFunctionN p_Var24;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  AABBNodeMB4D *node1;
  NodeRef *pNVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  NodeRef *pNVar38;
  size_t sVar39;
  ulong uVar40;
  float fVar41;
  float fVar42;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar43 [16];
  float fVar50;
  float fVar55;
  float fVar56;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar57;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar58;
  float fVar63;
  float fVar64;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar65;
  float fVar66;
  float fVar70;
  float fVar71;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar72;
  float fVar73;
  uint uVar74;
  float fVar75;
  uint uVar76;
  float fVar77;
  uint uVar78;
  float fVar79;
  uint uVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  NodeRef *local_a68;
  ulong local_a48;
  undefined1 local_a18 [16];
  long local_a08;
  long local_a00;
  ulong local_9f8;
  undefined1 (*local_9f0) [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  float local_898 [4];
  float local_888 [4];
  float local_878 [4];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar13 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar14 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar15 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar16 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar17 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar18 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_9f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar36 = local_9f8 ^ 0x10;
  iVar19 = (tray->tnear).field_0.i[k];
  iVar20 = (tray->tfar).field_0.i[k];
  local_9f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_a68 = stack + 1;
LAB_006f6f84:
  do {
    pNVar38 = local_a68;
    if (pNVar38 == stack) {
LAB_006f77ba:
      return pNVar38 != stack;
    }
    pNVar33 = pNVar38 + -1;
    sVar39 = pNVar38[-1].ptr;
    local_a68 = pNVar33;
    while ((sVar39 & 8) == 0) {
      pNVar33 = (NodeRef *)(sVar39 & 0xfffffffffffffff0);
      fVar42 = *(float *)(ray + k * 4 + 0x70);
      pfVar5 = (float *)((long)&pNVar33[0x10].ptr + local_9f8);
      pfVar1 = (float *)((long)&pNVar33[4].ptr + local_9f8);
      auVar62._0_4_ = ((*pfVar5 * fVar42 + *pfVar1) - fVar13) * fVar16;
      auVar62._4_4_ = ((pfVar5[1] * fVar42 + pfVar1[1]) - fVar13) * fVar16;
      auVar62._8_4_ = ((pfVar5[2] * fVar42 + pfVar1[2]) - fVar13) * fVar16;
      auVar62._12_4_ = ((pfVar5[3] * fVar42 + pfVar1[3]) - fVar13) * fVar16;
      auVar60._4_4_ = iVar19;
      auVar60._0_4_ = iVar19;
      auVar60._8_4_ = iVar19;
      auVar60._12_4_ = iVar19;
      auVar51 = maxps(auVar60,auVar62);
      pfVar5 = (float *)((long)&pNVar33[0x10].ptr + uVar35);
      pfVar1 = (float *)((long)&pNVar33[4].ptr + uVar35);
      auVar59._0_4_ = ((*pfVar5 * fVar42 + *pfVar1) - fVar14) * fVar17;
      auVar59._4_4_ = ((pfVar5[1] * fVar42 + pfVar1[1]) - fVar14) * fVar17;
      auVar59._8_4_ = ((pfVar5[2] * fVar42 + pfVar1[2]) - fVar14) * fVar17;
      auVar59._12_4_ = ((pfVar5[3] * fVar42 + pfVar1[3]) - fVar14) * fVar17;
      pfVar5 = (float *)((long)&pNVar33[0x10].ptr + uVar40);
      pfVar1 = (float *)((long)&pNVar33[4].ptr + uVar40);
      auVar67._0_4_ = ((*pfVar5 * fVar42 + *pfVar1) - fVar15) * fVar18;
      auVar67._4_4_ = ((pfVar5[1] * fVar42 + pfVar1[1]) - fVar15) * fVar18;
      auVar67._8_4_ = ((pfVar5[2] * fVar42 + pfVar1[2]) - fVar15) * fVar18;
      auVar67._12_4_ = ((pfVar5[3] * fVar42 + pfVar1[3]) - fVar15) * fVar18;
      auVar60 = maxps(auVar59,auVar67);
      auVar60 = maxps(auVar51,auVar60);
      pfVar5 = (float *)((long)&pNVar33[0x10].ptr + uVar36);
      pfVar1 = (float *)((long)&pNVar33[4].ptr + uVar36);
      auVar68._0_4_ = ((*pfVar5 * fVar42 + *pfVar1) - fVar13) * fVar16;
      auVar68._4_4_ = ((pfVar5[1] * fVar42 + pfVar1[1]) - fVar13) * fVar16;
      auVar68._8_4_ = ((pfVar5[2] * fVar42 + pfVar1[2]) - fVar13) * fVar16;
      auVar68._12_4_ = ((pfVar5[3] * fVar42 + pfVar1[3]) - fVar13) * fVar16;
      auVar61._4_4_ = iVar20;
      auVar61._0_4_ = iVar20;
      auVar61._8_4_ = iVar20;
      auVar61._12_4_ = iVar20;
      auVar62 = minps(auVar61,auVar68);
      pfVar5 = (float *)((long)&pNVar33[0x10].ptr + (uVar35 ^ 0x10));
      pfVar1 = (float *)((long)&pNVar33[4].ptr + (uVar35 ^ 0x10));
      auVar69._0_4_ = ((*pfVar5 * fVar42 + *pfVar1) - fVar14) * fVar17;
      auVar69._4_4_ = ((pfVar5[1] * fVar42 + pfVar1[1]) - fVar14) * fVar17;
      auVar69._8_4_ = ((pfVar5[2] * fVar42 + pfVar1[2]) - fVar14) * fVar17;
      auVar69._12_4_ = ((pfVar5[3] * fVar42 + pfVar1[3]) - fVar14) * fVar17;
      pfVar5 = (float *)((long)&pNVar33[0x10].ptr + (uVar40 ^ 0x10));
      pfVar1 = (float *)((long)&pNVar33[4].ptr + (uVar40 ^ 0x10));
      auVar51._4_4_ = ((pfVar5[1] * fVar42 + pfVar1[1]) - fVar15) * fVar18;
      auVar51._0_4_ = ((*pfVar5 * fVar42 + *pfVar1) - fVar15) * fVar18;
      auVar51._8_4_ = ((pfVar5[2] * fVar42 + pfVar1[2]) - fVar15) * fVar18;
      auVar51._12_4_ = ((pfVar5[3] * fVar42 + pfVar1[3]) - fVar15) * fVar18;
      auVar51 = minps(auVar69,auVar51);
      auVar51 = minps(auVar62,auVar51);
      bVar27 = auVar60._0_4_ <= auVar51._0_4_;
      bVar28 = auVar60._4_4_ <= auVar51._4_4_;
      bVar29 = auVar60._8_4_ <= auVar51._8_4_;
      bVar30 = auVar60._12_4_ <= auVar51._12_4_;
      if (((uint)sVar39 & 7) == 6) {
        bVar27 = (fVar42 < *(float *)&pNVar33[0x1e].ptr && *(float *)&pNVar33[0x1c].ptr <= fVar42)
                 && bVar27;
        bVar28 = (fVar42 < *(float *)((long)&pNVar33[0x1e].ptr + 4) &&
                 *(float *)((long)&pNVar33[0x1c].ptr + 4) <= fVar42) && bVar28;
        bVar29 = (fVar42 < *(float *)&pNVar33[0x1f].ptr && *(float *)&pNVar33[0x1d].ptr <= fVar42)
                 && bVar29;
        bVar30 = (fVar42 < *(float *)((long)&pNVar33[0x1f].ptr + 4) &&
                 *(float *)((long)&pNVar33[0x1d].ptr + 4) <= fVar42) && bVar30;
      }
      auVar52._0_4_ = (uint)bVar27 * -0x80000000;
      auVar52._4_4_ = (uint)bVar28 * -0x80000000;
      auVar52._8_4_ = (uint)bVar29 * -0x80000000;
      auVar52._12_4_ = (uint)bVar30 * -0x80000000;
      uVar34 = movmskps((int)root.ptr,auVar52);
      root.ptr = (size_t)uVar34;
      if (uVar34 == 0) goto LAB_006f6f84;
      root.ptr = (size_t)(byte)uVar34;
      lVar25 = 0;
      if (root.ptr != 0) {
        for (; ((byte)uVar34 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
        }
      }
      sVar39 = pNVar33[lVar25].ptr;
      uVar34 = (uVar34 & 0xff) - 1 & uVar34 & 0xff;
      uVar37 = (ulong)uVar34;
      if (uVar34 != 0) {
        do {
          root.ptr = uVar37;
          local_a68->ptr = sVar39;
          local_a68 = local_a68 + 1;
          lVar25 = 0;
          if (root.ptr != 0) {
            for (; (root.ptr >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
            }
          }
          sVar39 = pNVar33[lVar25].ptr;
          uVar37 = root.ptr - 1 & root.ptr;
        } while (uVar37 != 0);
      }
    }
    local_a00 = (ulong)((uint)sVar39 & 0xf) - 8;
    uVar37 = sVar39 & 0xfffffffffffffff0;
    for (local_a08 = 0; local_a08 != local_a00; local_a08 = local_a08 + 1) {
      root.ptr = local_a08 * 0x140;
      fVar42 = *(float *)(ray + k * 4 + 0x70);
      pfVar5 = (float *)(uVar37 + 0x90 + root.ptr);
      pfVar1 = (float *)(uVar37 + root.ptr);
      fVar50 = *pfVar5 * fVar42 + *pfVar1;
      fVar55 = pfVar5[1] * fVar42 + pfVar1[1];
      fVar56 = pfVar5[2] * fVar42 + pfVar1[2];
      fVar57 = pfVar5[3] * fVar42 + pfVar1[3];
      pfVar5 = (float *)(uVar37 + 0xa0 + root.ptr);
      pfVar1 = (float *)(uVar37 + 0x10 + root.ptr);
      fVar58 = *pfVar5 * fVar42 + *pfVar1;
      fVar63 = pfVar5[1] * fVar42 + pfVar1[1];
      fVar64 = pfVar5[2] * fVar42 + pfVar1[2];
      fVar65 = pfVar5[3] * fVar42 + pfVar1[3];
      pfVar5 = (float *)(uVar37 + 0xb0 + root.ptr);
      pfVar1 = (float *)(uVar37 + 0x20 + root.ptr);
      fVar66 = *pfVar5 * fVar42 + *pfVar1;
      fVar70 = pfVar5[1] * fVar42 + pfVar1[1];
      fVar71 = pfVar5[2] * fVar42 + pfVar1[2];
      fVar72 = pfVar5[3] * fVar42 + pfVar1[3];
      pfVar6 = (float *)(uVar37 + 0xc0 + root.ptr);
      pfVar1 = (float *)(uVar37 + 0x30 + root.ptr);
      pfVar7 = (float *)(uVar37 + 0xd0 + root.ptr);
      pfVar5 = (float *)(uVar37 + 0x40 + root.ptr);
      pfVar8 = (float *)(uVar37 + 0xe0 + root.ptr);
      pfVar2 = (float *)(uVar37 + 0x50 + root.ptr);
      pfVar9 = (float *)(uVar37 + 0xf0 + root.ptr);
      pfVar3 = (float *)(uVar37 + 0x60 + root.ptr);
      pfVar10 = (float *)(uVar37 + 0x100 + root.ptr);
      pfVar4 = (float *)(uVar37 + 0x70 + root.ptr);
      pfVar11 = (float *)(uVar37 + 0x110 + root.ptr);
      pfVar12 = (float *)(uVar37 + 0x80 + root.ptr);
      fVar85 = fVar50 - (*pfVar6 * fVar42 + *pfVar1);
      fVar86 = fVar55 - (pfVar6[1] * fVar42 + pfVar1[1]);
      fVar87 = fVar56 - (pfVar6[2] * fVar42 + pfVar1[2]);
      fVar88 = fVar57 - (pfVar6[3] * fVar42 + pfVar1[3]);
      fVar93 = fVar58 - (*pfVar7 * fVar42 + *pfVar5);
      fVar95 = fVar63 - (pfVar7[1] * fVar42 + pfVar5[1]);
      fVar97 = fVar64 - (pfVar7[2] * fVar42 + pfVar5[2]);
      fVar99 = fVar65 - (pfVar7[3] * fVar42 + pfVar5[3]);
      fVar101 = fVar66 - (*pfVar8 * fVar42 + *pfVar2);
      fVar102 = fVar70 - (pfVar8[1] * fVar42 + pfVar2[1]);
      fVar103 = fVar71 - (pfVar8[2] * fVar42 + pfVar2[2]);
      fVar104 = fVar72 - (pfVar8[3] * fVar42 + pfVar2[3]);
      fVar41 = (*pfVar9 * fVar42 + *pfVar3) - fVar50;
      fVar44 = (pfVar9[1] * fVar42 + pfVar3[1]) - fVar55;
      fVar46 = (pfVar9[2] * fVar42 + pfVar3[2]) - fVar56;
      fVar48 = (pfVar9[3] * fVar42 + pfVar3[3]) - fVar57;
      fVar81 = (*pfVar10 * fVar42 + *pfVar4) - fVar58;
      fVar82 = (pfVar10[1] * fVar42 + pfVar4[1]) - fVar63;
      fVar83 = (pfVar10[2] * fVar42 + pfVar4[2]) - fVar64;
      fVar84 = (pfVar10[3] * fVar42 + pfVar4[3]) - fVar65;
      fVar73 = (fVar42 * *pfVar11 + *pfVar12) - fVar66;
      fVar75 = (fVar42 * pfVar11[1] + pfVar12[1]) - fVar70;
      fVar77 = (fVar42 * pfVar11[2] + pfVar12[2]) - fVar71;
      fVar79 = (fVar42 * pfVar11[3] + pfVar12[3]) - fVar72;
      local_898[0] = fVar101 * fVar81 - fVar93 * fVar73;
      local_898[1] = fVar102 * fVar82 - fVar95 * fVar75;
      local_898[2] = fVar103 * fVar83 - fVar97 * fVar77;
      local_898[3] = fVar104 * fVar84 - fVar99 * fVar79;
      fVar42 = *(float *)(ray + k * 4);
      fVar45 = *(float *)(ray + k * 4 + 0x10);
      fVar47 = *(float *)(ray + k * 4 + 0x40);
      fVar49 = *(float *)(ray + k * 4 + 0x50);
      fVar50 = fVar50 - fVar42;
      fVar55 = fVar55 - fVar42;
      fVar56 = fVar56 - fVar42;
      fVar57 = fVar57 - fVar42;
      fVar58 = fVar58 - fVar45;
      fVar63 = fVar63 - fVar45;
      fVar64 = fVar64 - fVar45;
      fVar65 = fVar65 - fVar45;
      fVar105 = fVar50 * fVar49 - fVar58 * fVar47;
      fVar106 = fVar55 * fVar49 - fVar63 * fVar47;
      fVar107 = fVar56 * fVar49 - fVar64 * fVar47;
      fVar108 = fVar57 * fVar49 - fVar65 * fVar47;
      local_888[0] = fVar85 * fVar73 - fVar101 * fVar41;
      local_888[1] = fVar86 * fVar75 - fVar102 * fVar44;
      local_888[2] = fVar87 * fVar77 - fVar103 * fVar46;
      local_888[3] = fVar88 * fVar79 - fVar104 * fVar48;
      fVar42 = *(float *)(ray + k * 4 + 0x20);
      fVar45 = *(float *)(ray + k * 4 + 0x60);
      fVar66 = fVar66 - fVar42;
      fVar70 = fVar70 - fVar42;
      fVar71 = fVar71 - fVar42;
      fVar72 = fVar72 - fVar42;
      fVar109 = fVar66 * fVar47 - fVar50 * fVar45;
      fVar110 = fVar70 * fVar47 - fVar55 * fVar45;
      fVar111 = fVar71 * fVar47 - fVar56 * fVar45;
      fVar112 = fVar72 * fVar47 - fVar57 * fVar45;
      local_878[0] = fVar93 * fVar41 - fVar85 * fVar81;
      local_878[1] = fVar95 * fVar44 - fVar86 * fVar82;
      local_878[2] = fVar97 * fVar46 - fVar87 * fVar83;
      local_878[3] = fVar99 * fVar48 - fVar88 * fVar84;
      fVar94 = fVar58 * fVar45 - fVar66 * fVar49;
      fVar96 = fVar63 * fVar45 - fVar70 * fVar49;
      fVar98 = fVar64 * fVar45 - fVar71 * fVar49;
      fVar100 = fVar65 * fVar45 - fVar72 * fVar49;
      fVar89 = fVar47 * local_898[0] + fVar49 * local_888[0] + fVar45 * local_878[0];
      fVar90 = fVar47 * local_898[1] + fVar49 * local_888[1] + fVar45 * local_878[1];
      fVar91 = fVar47 * local_898[2] + fVar49 * local_888[2] + fVar45 * local_878[2];
      fVar92 = fVar47 * local_898[3] + fVar49 * local_888[3] + fVar45 * local_878[3];
      uVar74 = (uint)fVar89 & 0x80000000;
      uVar76 = (uint)fVar90 & 0x80000000;
      uVar78 = (uint)fVar91 & 0x80000000;
      uVar80 = (uint)fVar92 & 0x80000000;
      fVar42 = (float)((uint)(fVar41 * fVar94 + fVar81 * fVar109 + fVar73 * fVar105) ^ uVar74);
      fVar45 = (float)((uint)(fVar44 * fVar96 + fVar82 * fVar110 + fVar75 * fVar106) ^ uVar76);
      fVar47 = (float)((uint)(fVar46 * fVar98 + fVar83 * fVar111 + fVar77 * fVar107) ^ uVar78);
      fVar49 = (float)((uint)(fVar48 * fVar100 + fVar84 * fVar112 + fVar79 * fVar108) ^ uVar80);
      fVar73 = (float)((uint)(fVar94 * fVar85 + fVar109 * fVar93 + fVar105 * fVar101) ^ uVar74);
      fVar75 = (float)((uint)(fVar96 * fVar86 + fVar110 * fVar95 + fVar106 * fVar102) ^ uVar76);
      fVar77 = (float)((uint)(fVar98 * fVar87 + fVar111 * fVar97 + fVar107 * fVar103) ^ uVar78);
      fVar79 = (float)((uint)(fVar100 * fVar88 + fVar112 * fVar99 + fVar108 * fVar104) ^ uVar80);
      fVar41 = ABS(fVar89);
      fVar44 = ABS(fVar90);
      fVar46 = ABS(fVar91);
      fVar48 = ABS(fVar92);
      bVar27 = ((0.0 <= fVar73 && 0.0 <= fVar42) && fVar89 != 0.0) && fVar42 + fVar73 <= fVar41;
      bVar28 = ((0.0 <= fVar75 && 0.0 <= fVar45) && fVar90 != 0.0) && fVar45 + fVar75 <= fVar44;
      bVar29 = ((0.0 <= fVar77 && 0.0 <= fVar47) && fVar91 != 0.0) && fVar47 + fVar77 <= fVar46;
      bVar30 = ((0.0 <= fVar79 && 0.0 <= fVar49) && fVar92 != 0.0) && fVar49 + fVar79 <= fVar48;
      auVar32._4_4_ = -(uint)bVar28;
      auVar32._0_4_ = -(uint)bVar27;
      auVar32._8_4_ = -(uint)bVar29;
      auVar32._12_4_ = -(uint)bVar30;
      uVar34 = movmskps((int)pNVar33,auVar32);
      pNVar33 = (NodeRef *)(ulong)uVar34;
      if (uVar34 != 0) {
        fVar58 = (float)(uVar74 ^ (uint)(fVar50 * local_898[0] +
                                        fVar58 * local_888[0] + fVar66 * local_878[0]));
        fVar63 = (float)(uVar76 ^ (uint)(fVar55 * local_898[1] +
                                        fVar63 * local_888[1] + fVar70 * local_878[1]));
        fVar56 = (float)(uVar78 ^ (uint)(fVar56 * local_898[2] +
                                        fVar64 * local_888[2] + fVar71 * local_878[2]));
        fVar57 = (float)(uVar80 ^ (uint)(fVar57 * local_898[3] +
                                        fVar65 * local_888[3] + fVar72 * local_878[3]));
        fVar50 = *(float *)(ray + k * 4 + 0x30);
        fVar55 = *(float *)(ray + k * 4 + 0x80);
        auVar53._0_4_ = -(uint)((fVar58 <= fVar55 * fVar41 && fVar50 * fVar41 < fVar58) && bVar27);
        auVar53._4_4_ = -(uint)((fVar63 <= fVar55 * fVar44 && fVar50 * fVar44 < fVar63) && bVar28);
        auVar53._8_4_ = -(uint)((fVar56 <= fVar55 * fVar46 && fVar50 * fVar46 < fVar56) && bVar29);
        auVar53._12_4_ = -(uint)((fVar57 <= fVar55 * fVar48 && fVar50 * fVar48 < fVar57) && bVar30);
        uVar34 = movmskps(uVar34,auVar53);
        pNVar33 = (NodeRef *)(ulong)uVar34;
        if (uVar34 != 0) {
          root.ptr = root.ptr + uVar37;
          pSVar22 = context->scene;
          auVar31._4_4_ = fVar44;
          auVar31._0_4_ = fVar41;
          auVar31._8_4_ = fVar46;
          auVar31._12_4_ = fVar48;
          auVar51 = rcpps(auVar53,auVar31);
          fVar50 = auVar51._0_4_;
          fVar64 = auVar51._4_4_;
          fVar65 = auVar51._8_4_;
          fVar66 = auVar51._12_4_;
          fVar50 = (1.0 - fVar41 * fVar50) * fVar50 + fVar50;
          fVar64 = (1.0 - fVar44 * fVar64) * fVar64 + fVar64;
          fVar65 = (1.0 - fVar46 * fVar65) * fVar65 + fVar65;
          fVar66 = (1.0 - fVar48 * fVar66) * fVar66 + fVar66;
          local_8a8[0] = fVar58 * fVar50;
          local_8a8[1] = fVar63 * fVar64;
          local_8a8[2] = fVar56 * fVar65;
          local_8a8[3] = fVar57 * fVar66;
          local_8c8._0_4_ = fVar42 * fVar50;
          local_8c8._4_4_ = fVar45 * fVar64;
          local_8c8._8_4_ = fVar47 * fVar65;
          local_8c8._12_4_ = fVar49 * fVar66;
          local_8b8._0_4_ = fVar50 * fVar73;
          local_8b8._4_4_ = fVar64 * fVar75;
          local_8b8._8_4_ = fVar65 * fVar77;
          local_8b8._12_4_ = fVar66 * fVar79;
          local_a48 = (ulong)(byte)uVar34;
          do {
            uVar26 = 0;
            if (local_a48 != 0) {
              for (; (local_a48 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            local_808 = *(uint *)(root.ptr + 0x120 + uVar26 * 4);
            pGVar23 = (pSVar22->geometries).items[local_808].ptr;
            if ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar23->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_838 = *(undefined4 *)(local_8c8 + uVar26 * 4);
                fVar42 = local_8a8[uVar26 - 4];
                *(float *)(ray + k * 4 + 0x80) = local_8a8[uVar26];
                args.context = context->user;
                uVar21 = *(undefined4 *)(root.ptr + 0x130 + uVar26 * 4);
                local_818._4_4_ = uVar21;
                local_818._0_4_ = uVar21;
                local_818._8_4_ = uVar21;
                local_818._12_4_ = uVar21;
                local_828._4_4_ = fVar42;
                local_828._0_4_ = fVar42;
                local_828._8_4_ = fVar42;
                local_828._12_4_ = fVar42;
                local_868 = local_898[uVar26];
                local_858 = local_888[uVar26];
                local_848 = local_878[uVar26];
                fStack_864 = local_868;
                fStack_860 = local_868;
                fStack_85c = local_868;
                fStack_854 = local_858;
                fStack_850 = local_858;
                fStack_84c = local_858;
                fStack_844 = local_848;
                fStack_840 = local_848;
                fStack_83c = local_848;
                uStack_834 = local_838;
                uStack_830 = local_838;
                uStack_82c = local_838;
                uStack_804 = local_808;
                uStack_800 = local_808;
                uStack_7fc = local_808;
                local_7f8 = (args.context)->instID[0];
                uStack_7f4 = local_7f8;
                uStack_7f0 = local_7f8;
                uStack_7ec = local_7f8;
                local_7e8 = (args.context)->instPrimID[0];
                uStack_7e4 = local_7e8;
                uStack_7e0 = local_7e8;
                uStack_7dc = local_7e8;
                local_a18 = *local_9f0;
                args.valid = (int *)local_a18;
                args.geometryUserPtr = pGVar23->userPtr;
                args.hit = (RTCHitN *)&local_868;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar23->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar23->occlusionFilterN)(&args);
                }
                if (local_a18 == (undefined1  [16])0x0) {
                  auVar54._8_4_ = 0xffffffff;
                  auVar54._0_8_ = 0xffffffffffffffff;
                  auVar54._12_4_ = 0xffffffff;
                  auVar54 = auVar54 ^ _DAT_01f46b70;
                }
                else {
                  p_Var24 = context->args->filter;
                  if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar23->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var24)(&args);
                  }
                  auVar43._0_4_ = -(uint)(local_a18._0_4_ == 0);
                  auVar43._4_4_ = -(uint)(local_a18._4_4_ == 0);
                  auVar43._8_4_ = -(uint)(local_a18._8_4_ == 0);
                  auVar43._12_4_ = -(uint)(local_a18._12_4_ == 0);
                  auVar54 = auVar43 ^ _DAT_01f46b70;
                  auVar51 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar43);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar51;
                }
                if ((_DAT_01f46b40 & auVar54) == (undefined1  [16])0x0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar55;
                  goto LAB_006f7719;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_006f77ba;
            }
LAB_006f7719:
            local_a48 = local_a48 ^ 1L << (uVar26 & 0x3f);
          } while (local_a48 != 0);
          pNVar33 = (NodeRef *)0x0;
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }